

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapequad.cpp
# Opt level: O0

void pzshape::TPZShapeQuad::Shape2dQuadInternal
               (TPZVec<Fad<double>_> *x,int order,TPZVec<Fad<double>_> *phi,
               int quad_transformation_index)

{
  undefined *puVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  Fad<double> *pFVar5;
  TPZVec<Fad<double>_> *pTVar6;
  Fad<double> *this;
  TPZVec<Fad<double>_> *in_RDX;
  int in_ESI;
  int index;
  int j;
  int i;
  TPZVec<Fad<double>_> phi1;
  TPZVec<Fad<double>_> phi0;
  TPZVec<Fad<double>_> out;
  int numshape;
  int ord1;
  int ndim;
  Fad<double> *in_stack_fffffffffffffe60;
  double *in_stack_fffffffffffffe70;
  undefined8 in_stack_fffffffffffffe78;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *fadexpr;
  Fad<double> *in_stack_fffffffffffffe80;
  TPZVec<Fad<double>_> *in_stack_fffffffffffffe98;
  int64_t in_stack_fffffffffffffeb8;
  TPZVec<Fad<double>_> *in_stack_fffffffffffffec0;
  TPZVec<Fad<double>_> *in_stack_fffffffffffffed0;
  int local_118;
  int local_114;
  TPZVec<Fad<double>_> local_e8;
  undefined8 local_c8;
  TPZVec<Fad<double>_> *in_stack_ffffffffffffff50;
  TPZVec<Fad<double>_> *in_stack_ffffffffffffff58;
  undefined1 local_a0 [4];
  int in_stack_ffffffffffffff64;
  undefined1 local_78 [48];
  TPZVec<Fad<double>_> local_48;
  int local_28;
  int local_24;
  undefined4 local_20;
  TPZVec<Fad<double>_> *local_18;
  
  iVar3 = (int)((ulong)in_stack_fffffffffffffe78 >> 0x20);
  local_20 = 3;
  if (in_ESI < 0) {
    return;
  }
  local_24 = in_ESI + 1;
  local_28 = local_24 * local_24;
  pTVar6 = &local_48;
  local_18 = in_RDX;
  TPZVec<Fad<double>_>::TPZVec(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  TransformPoint2dQ(in_stack_ffffffffffffff64,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  lVar4 = (long)local_28;
  pFVar5 = (Fad<double> *)TPZVec<Fad<double>_>::NElements(local_18);
  if (lVar4 <= (long)pFVar5) {
    TPZVec<Fad<double>_>::operator[](local_18,0);
    iVar2 = Fad<double>::size((Fad<double> *)0x18914c4);
    if (2 < iVar2) goto LAB_01891584;
  }
  lVar4 = (long)local_28;
  in_stack_fffffffffffffe98 = local_18;
  Fad<double>::Fad(in_stack_fffffffffffffe80,iVar3,in_stack_fffffffffffffe70);
  (*in_stack_fffffffffffffe98->_vptr_TPZVec[2])(in_stack_fffffffffffffe98,lVar4,local_78);
  Fad<double>::~Fad(in_stack_fffffffffffffe60);
LAB_01891584:
  local_c8 = 0;
  Fad<double>::Fad(in_stack_fffffffffffffe80,iVar3,in_stack_fffffffffffffe70);
  TPZVec<Fad<double>_>::TPZVec(in_stack_fffffffffffffed0,(int64_t)pTVar6,pFVar5);
  Fad<double>::~Fad(in_stack_fffffffffffffe60);
  Fad<double>::Fad(in_stack_fffffffffffffe80,iVar3,in_stack_fffffffffffffe70);
  TPZVec<Fad<double>_>::TPZVec(in_stack_fffffffffffffed0,(int64_t)pTVar6,pFVar5);
  Fad<double>::~Fad(in_stack_fffffffffffffe60);
  puVar1 = TPZShapeLinear::FADfOrthogonal;
  pFVar5 = TPZVec<Fad<double>_>::operator[](&local_48,0);
  (*(code *)puVar1)(pFVar5,local_24,local_a0);
  fadexpr = (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)TPZShapeLinear::FADfOrthogonal;
  pTVar6 = (TPZVec<Fad<double>_> *)TPZVec<Fad<double>_>::operator[](&local_48,1);
  (*(code *)fadexpr)(pTVar6,local_24,&local_e8);
  for (local_114 = 0; local_114 < local_24; local_114 = local_114 + 1) {
    for (local_118 = 0; local_118 < local_24; local_118 = local_118 + 1) {
      iVar3 = local_114 * local_24;
      TPZVec<Fad<double>_>::operator[]((TPZVec<Fad<double>_> *)local_a0,(long)local_114);
      TPZVec<Fad<double>_>::operator[](&local_e8,(long)local_118);
      operator*<Fad<double>,_Fad<double>,_nullptr>((Fad<double> *)in_stack_fffffffffffffe98,pFVar5);
      this = TPZVec<Fad<double>_>::operator[](local_18,(long)(iVar3 + local_118));
      Fad<double>::operator=((Fad<double> *)pTVar6,fadexpr);
      FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)this);
    }
  }
  TPZVec<Fad<double>_>::~TPZVec(pTVar6);
  TPZVec<Fad<double>_>::~TPZVec(pTVar6);
  TPZVec<Fad<double>_>::~TPZVec(pTVar6);
  return;
}

Assistant:

void TPZShapeQuad::Shape2dQuadInternal(TPZVec<FADREAL> &x, int order,
										   TPZVec<FADREAL> &phi,int quad_transformation_index) {
		
		const int ndim = 3;
		if(order < 0) return;
		int ord1 = order+1;
		int numshape = ord1*ord1;
		TPZVec<FADREAL> out(2);
		TransformPoint2dQ(quad_transformation_index,x,out);
		
		if(numshape > phi.NElements()/*Rows()*/ || phi[0].size()/*Cols()*/ < ndim) phi.Resize(numshape, FADREAL(ndim, 0.0));
		//if(dphi.Rows() < 2 || dphi.Cols() < numshape) dphi.Resize(2,numshape);
		//REAL store1[20],store2[20],store3[20],store4[20];
		//TPZFMatrix<REAL> phi0(ord1,1,store1,20),phi1(ord1,1,store2,20),dphi0(1,ord1,store3,20),dphi1(1,ord1,store4,20);
		TPZVec<FADREAL> phi0(20, FADREAL(ndim, 0.0)),
		phi1(20, FADREAL(ndim, 0.0));
		
		TPZShapeLinear::FADfOrthogonal(out[0],ord1,phi0);
		TPZShapeLinear::FADfOrthogonal(out[1],ord1,phi1);
		for (int i=0;i<ord1;i++) {
			for (int j=0;j<ord1;j++) {
				int index = i*ord1+j;
				//phi(index,0) =  phi0(i,0)* phi1(j,0);
				phi[index] =  phi0[i] * phi1[j];
				/*dphi(0,index) = dphi0(0,i)* phi1(j,0);
				 dphi(1,index) =  phi0(i,0)*dphi1(0,j);*/
			}
		}
		//  TransformDerivative2dQ(quad_transformation_index,numshape,phi);
	}